

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O1

int __thiscall
libtorrent::aux::session_impl::listen_port(session_impl *this,transport ssl,address *param_2)

{
  ushort uVar1;
  uint uVar2;
  shared_ptr<libtorrent::aux::listen_socket_t> *psVar3;
  element_type *peVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it_00;
  transport local_41;
  transport *local_40;
  address *local_38;
  
  local_40 = &local_41;
  __it_00._M_current =
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)psVar3 - (long)__it_00._M_current >> 6;
  local_41 = ssl;
  local_38 = param_2;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                            *)&local_40,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar5) goto LAB_002d46c6;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                            *)&local_40,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar5) goto LAB_002d46c6;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                            *)&local_40,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar5) goto LAB_002d46c6;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
              ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                            *)&local_40,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar5) goto LAB_002d46c6;
      __it_00._M_current = __it_00._M_current + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = (long)psVar3 - (long)__it_00._M_current >> 4;
  if (lVar7 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar7 != 2) {
      __it._M_current = psVar3;
      if ((lVar7 != 3) ||
         (bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
                  ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                                *)&local_40,__it_00), __it._M_current = __it_00._M_current, bVar5))
      goto LAB_002d46c6;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it);
    if (bVar5) goto LAB_002d46c6;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar5 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::$_0>
          ::operator()((_Iter_pred<libtorrent::aux::session_impl::listen_port(libtorrent::aux::transport,boost::asio::ip::address_const&)const::__0>
                        *)&local_40,__it_00);
  __it._M_current = psVar3;
  if (bVar5) {
    __it._M_current = __it_00._M_current;
  }
LAB_002d46c6:
  if (__it._M_current ==
      (this->m_listen_sockets).
      super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar6 = 0;
  }
  else {
    peVar4 = ((__it._M_current)->
             super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar2 = (peVar4->tcp_port_mapping).super_array<libtorrent::aux::listen_port_mapping,_2UL>.
            _M_elems[0].port;
    if (uVar2 == 0) {
      lVar7 = 0;
      do {
        bVar5 = lVar7 == 8;
        uVar6 = uVar2;
        if (bVar5) break;
        uVar6 = *(uint *)((long)&(peVar4->tcp_port_mapping).
                                 super_array<libtorrent::aux::listen_port_mapping,_2UL>._M_elems[1].
                                 port + lVar7);
        lVar7 = lVar7 + 8;
      } while (uVar6 == 0);
    }
    else {
      bVar5 = false;
      uVar6 = uVar2;
    }
    if (bVar5) {
      uVar1 = (peVar4->local_endpoint).impl_.data_.v4.sin_port;
      uVar6 = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
    }
  }
  return uVar6;
}

Assistant:

int session_impl::listen_port(transport const ssl, address const& local_addr) const
	{
		auto socket = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&](std::shared_ptr<listen_socket_t> const& e)
		{
			if (!(e->flags & listen_socket_t::accept_incoming)) return false;
			auto const& listen_addr = e->external_address.external_address();
			return e->ssl == ssl
				&& (listen_addr == local_addr
					|| (listen_addr.is_v4() == local_addr.is_v4() && listen_addr.is_unspecified()));
		});
		if (socket != m_listen_sockets.end())
			return (*socket)->tcp_external_port();
		return 0;
	}